

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::Color::operator<<(ostream *s,Enum code)

{
  ostream *in_RDI;
  ostream *unaff_retaddr;
  
  anon_unknown_14::color_to_stream(unaff_retaddr,(Enum)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& s, Color::Enum code) {
        color_to_stream(s, code);
        return s;
    }